

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::SizeAtCapacity(RepeatedPtrFieldBase *this)

{
  byte bVar1;
  anon_class_40_5_beb31822 add;
  anon_class_40_5_beb31822 add_00;
  anon_class_40_5_beb31822 add_01;
  unsigned_long uVar2;
  char cVar3;
  Rep *pRVar4;
  byte *pbVar5;
  char *pcVar6;
  byte *pbVar7;
  int iVar8;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  code *unaff_RBX;
  char **p;
  uint uVar9;
  undefined8 unaff_RBP;
  char **ppcVar10;
  EpsCopyInputStream *this_00;
  UnknownFieldSet *this_01;
  int iVar11;
  char *pcVar12;
  byte *pbVar13;
  uint uVar14;
  ulong uVar15;
  pair<const_char_*,_int> pVar16;
  pair<const_char_*,_unsigned_long> pVar17;
  InternalMetadata *unaff_retaddr;
  RepeatedField<int> *this_02;
  code *pcVar18;
  undefined8 uVar19;
  InternalMetadata *this_03;
  int iStack_88;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  undefined2 uStack_68;
  RepeatedPtrFieldBase *pRStack_58;
  undefined8 local_20;
  RepeatedField<int> *pRStack_18;
  
  uVar14 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    pbVar5 = (byte *)(ulong)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar4 = rep(this);
    pbVar5 = (byte *)(ulong)(uint)pRVar4->allocated_size;
  }
  if ((int)pbVar5 < (int)uVar14) {
    this_00 = (EpsCopyInputStream *)(ulong)uVar14;
    SizeAtCapacity();
  }
  else {
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      this_00 = (EpsCopyInputStream *)(ulong)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar4 = rep(this);
      this_00 = (EpsCopyInputStream *)(ulong)(uint)pRVar4->allocated_size;
    }
    uVar14 = this->capacity_proxy_ + 1;
    pbVar5 = (byte *)(ulong)uVar14;
    if ((int)this_00 <= (int)uVar14) {
      return this->capacity_proxy_ < this->current_size_;
    }
  }
  SizeAtCapacity();
  bVar1 = *pbVar5;
  p = (char **)(ulong)bVar1;
  pRStack_58 = this;
  if ((char)bVar1 < '\0') {
    pVar16 = ReadSizeFallback((char *)pbVar5,(uint)bVar1);
    pbVar5 = (byte *)pVar16.first;
    if (pbVar5 == (byte *)0x0) {
      return false;
    }
    p = (char **)(ulong)(uint)pVar16.second;
  }
  else {
    pbVar5 = pbVar5 + 1;
  }
  pcVar6 = this_00->buffer_end_;
  iVar11 = (int)pcVar6 - (int)pbVar5;
  if (iVar11 < (int)p) {
    do {
      add.is_valid = (EnumValidityFuncWithArg *)pRStack_18;
      add.object = (void *)local_20;
      add.data = unaff_RBX;
      add.metadata = (InternalMetadata *)unaff_RBP;
      add._32_8_ = unaff_retaddr;
      this_02 = pRStack_18;
      pcVar18 = unaff_RBX;
      uVar19 = unaff_RBP;
      this_03 = unaff_retaddr;
      pcVar6 = ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                         ((char *)pbVar5,pcVar6,add);
      if (pcVar6 == (char *)0x0) {
        return false;
      }
      pcVar12 = this_00->buffer_end_;
      uVar14 = (int)pcVar6 - (int)pcVar12;
      if (0x10 < uVar14) {
        EpsCopyInputStream::
        ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                  ((EpsCopyInputStream *)&pcStack_80);
LAB_0026a839:
        ppcVar10 = &pcStack_80;
        EpsCopyInputStream::
        ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                  ();
        uVar2 = extraout_RDX;
        goto joined_r0x0026a853;
      }
      iVar8 = (int)p - iVar11;
      if (iVar8 < 0x11) {
        pcStack_70 = (char *)0x0;
        uStack_68 = 0;
        pcStack_80 = *(char **)pcVar12;
        pcStack_78 = *(char **)(pcVar12 + 8);
        pcVar12 = (char *)((long)&pcStack_80 + (long)iVar8);
        add_01.is_valid = (EnumValidityFuncWithArg *)pRStack_18;
        add_01.object = (void *)local_20;
        add_01.data = unaff_RBX;
        add_01.metadata = (InternalMetadata *)unaff_RBP;
        add_01._32_8_ = unaff_retaddr;
        pcVar6 = ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                           ((char *)((long)&pcStack_80 + (ulong)(uVar14 & 0x1f)),pcVar12,add_01);
        if (pcVar6 == pcVar12) {
          return (bool)(((char)pcVar6 - (char)&pcStack_80) + (char)this_00->buffer_end_);
        }
        return false;
      }
      uVar9 = (int)p - (iVar11 + uVar14);
      p = (char **)(ulong)uVar9;
      if ((int)uVar9 < 1) goto LAB_0026a839;
      if (this_00->limit_ < 0x11) {
        return false;
      }
      pcVar6 = EpsCopyInputStream::Next(this_00);
      if (pcVar6 == (char *)0x0) {
        return false;
      }
      pbVar5 = (byte *)(pcVar6 + (uVar14 & 0x1f));
      pcVar6 = this_00->buffer_end_;
      iVar11 = (int)pcVar6 - (int)pbVar5;
    } while (iVar11 < (int)uVar9);
  }
  add_00.is_valid = (EnumValidityFuncWithArg *)pRStack_18;
  add_00.object = (void *)local_20;
  add_00.data = unaff_RBX;
  add_00.metadata = (InternalMetadata *)unaff_RBP;
  add_00._32_8_ = unaff_retaddr;
  pbVar7 = (byte *)ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                             ((char *)pbVar5,(char *)(pbVar5 + (int)p),add_00);
  pbVar13 = (byte *)0x0;
  if (pbVar5 + (int)p == pbVar7) {
    pbVar13 = pbVar7;
  }
  return (bool)(char)pbVar13;
joined_r0x0026a853:
  if (ppcVar10 <= p) {
LAB_0026a8e0:
    return SUB81(p,0);
  }
  uVar15 = (ulong)(char)*(byte *)p;
  if ((long)uVar15 < 0) {
    pVar17 = VarintParseSlow64((char *)p,(uint)*(byte *)p);
    uVar15 = pVar17.second;
    if (pVar17.first == (char *)0x0) {
      p = (char **)0x0;
      goto LAB_0026a8e0;
    }
  }
  else {
    pVar17.second = uVar2;
    pVar17.first = (char *)((long)p + 1);
  }
  p = (char **)pVar17.first;
  cVar3 = (*pcVar18)(uVar19,uVar15 & 0xffffffff);
  if (cVar3 == '\0') {
    if ((this_03->ptr_ & 1U) == 0) {
      this_01 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                          (this_03);
    }
    else {
      this_01 = (UnknownFieldSet *)((this_03->ptr_ & 0xfffffffffffffffeU) + 8);
    }
    UnknownFieldSet::AddVarint(this_01,iStack_88,(long)(int)uVar15);
    uVar2 = extraout_RDX_01;
  }
  else {
    RepeatedField<int>::Add(this_02,(int)uVar15);
    uVar2 = extraout_RDX_00;
  }
  goto joined_r0x0026a853;
}

Assistant:

inline bool SizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This is equivalent to `current_size_ == Capacity()`.
    // Assuming `Capacity()` function is inlined, compiler is likely to optimize
    // away "+ kSSOCapacity" and reduce it to "current_size_ > capacity_proxy_"
    // which is an instruction less than "current_size_ == capacity_proxy_ + 1".
    return current_size_ >= Capacity();
  }